

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::checkSolution(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *sol)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  pointer pnVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  activity;
  cpp_dec_float<100U,_int,_void> local_2a8;
  cpp_dec_float<100U,_int,_void> local_258;
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  uint auStack_1d0 [2];
  cpp_dec_float<100U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  cpp_dec_float<100U,_int,_void> local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  lVar11 = (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar11) {
    do {
      pIVar3 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar10 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar11 + -1].idx;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_258,0,(type *)0x0);
      if (0 < pIVar3[iVar10].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar3 = pIVar3 + iVar10;
        lVar14 = 0;
        lVar13 = 0;
        do {
          pNVar4 = (pIVar3->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar12 = &(sol->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar4->val + 1) + lVar14)].m_backend;
          pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pNVar4->val).m_backend.data + lVar14);
          local_2a8.fpclass = cpp_dec_float_finite;
          local_2a8.prec_elem = 0x10;
          local_2a8.data._M_elems[0] = 0;
          local_2a8.data._M_elems[1] = 0;
          local_2a8.data._M_elems[2] = 0;
          local_2a8.data._M_elems[3] = 0;
          local_2a8.data._M_elems[4] = 0;
          local_2a8.data._M_elems[5] = 0;
          local_2a8.data._M_elems[6] = 0;
          local_2a8.data._M_elems[7] = 0;
          local_2a8.data._M_elems[8] = 0;
          local_2a8.data._M_elems[9] = 0;
          local_2a8.data._M_elems[10] = 0;
          local_2a8.data._M_elems[0xb] = 0;
          local_2a8.data._M_elems[0xc] = 0;
          local_2a8.data._M_elems[0xd] = 0;
          local_2a8.data._M_elems._56_5_ = 0;
          local_2a8.data._M_elems[0xf]._1_3_ = 0;
          local_2a8.exp = 0;
          local_2a8.neg = false;
          v = pcVar1;
          if ((&local_2a8 != pcVar12) && (v = pcVar12, pcVar1 != &local_2a8)) {
            local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_2a8.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_2a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_2a8.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_2a8.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_2a8.data._M_elems._56_5_ = SUB85(uVar7,0);
            local_2a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_2a8.exp = *(int *)((long)&(pNVar4->val).m_backend.data + lVar14 + 0x40);
            local_2a8.neg = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar14 + 0x44);
            local_2a8._72_8_ = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar14 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_2a8,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_258,&local_2a8);
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 0x54;
        } while (lVar13 < (pIVar3->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      lVar13 = lVar11 + -1;
      local_128.m_backend.data._M_elems[0xc] = local_258.data._M_elems[0xc];
      local_128.m_backend.data._M_elems[0xd] = local_258.data._M_elems[0xd];
      local_128.m_backend.data._M_elems[0xe] = local_258.data._M_elems[0xe];
      local_128.m_backend.data._M_elems[0xf] = local_258.data._M_elems[0xf];
      local_128.m_backend.data._M_elems[8] = local_258.data._M_elems[8];
      local_128.m_backend.data._M_elems[9] = local_258.data._M_elems[9];
      local_128.m_backend.data._M_elems[10] = local_258.data._M_elems[10];
      local_128.m_backend.data._M_elems[0xb] = local_258.data._M_elems[0xb];
      local_128.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
      local_128.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
      local_128.m_backend.data._M_elems[6] = local_258.data._M_elems[6];
      local_128.m_backend.data._M_elems[7] = local_258.data._M_elems[7];
      local_128.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
      local_128.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
      local_128.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
      local_128.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
      local_128.m_backend.exp = local_258.exp;
      local_128.m_backend.neg = local_258.neg;
      local_128.m_backend.fpclass = local_258.fpclass;
      local_128.m_backend.prec_elem = local_258.prec_elem;
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar13].m_backend.data;
      local_178.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar5[lVar13].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar5[lVar13].m_backend.data + 0x10);
      local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&pnVar5[lVar13].m_backend.data + 0x20);
      local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&pnVar5[lVar13].m_backend.data + 0x30);
      local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_178.m_backend.exp = pnVar5[lVar13].m_backend.exp;
      local_178.m_backend.neg = pnVar5[lVar13].m_backend.neg;
      local_178.m_backend.fpclass = pnVar5[lVar13].m_backend.fpclass;
      local_178.m_backend.prec_elem = pnVar5[lVar13].m_backend.prec_elem;
      feastol(&local_80,this);
      bVar9 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_128,&local_178,&local_80);
      uVar7 = local_258._72_8_;
      bVar6 = local_258.neg;
      iVar10 = local_258.exp;
      if (!bVar9) {
        return false;
      }
      local_1d8[0] = local_258.data._M_elems[0xc];
      local_1d8[1] = local_258.data._M_elems[0xd];
      auStack_1d0[0] = local_258.data._M_elems[0xe];
      auStack_1d0[1] = local_258.data._M_elems[0xf];
      local_1e8[0] = local_258.data._M_elems[8];
      local_1e8[1] = local_258.data._M_elems[9];
      auStack_1e0[0] = local_258.data._M_elems[10];
      auStack_1e0[1] = local_258.data._M_elems[0xb];
      local_1f8[0] = local_258.data._M_elems[4];
      local_1f8[1] = local_258.data._M_elems[5];
      auStack_1f0[0] = local_258.data._M_elems[6];
      auStack_1f0[1] = local_258.data._M_elems[7];
      local_208[0] = local_258.data._M_elems[0];
      local_208[1] = local_258.data._M_elems[1];
      auStack_200[0] = local_258.data._M_elems[2];
      auStack_200[1] = local_258.data._M_elems[3];
      pnVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar13].m_backend.data;
      local_1c8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[lVar13].m_backend.data + 8);
      puVar2 = (uint *)((long)&pnVar5[lVar13].m_backend.data + 0x10);
      local_1c8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_1c8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&pnVar5[lVar13].m_backend.data + 0x20);
      local_1c8.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_1c8.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&pnVar5[lVar13].m_backend.data + 0x30);
      local_1c8.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_1c8.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_1c8.exp = pnVar5[lVar13].m_backend.exp;
      local_1c8.neg = pnVar5[lVar13].m_backend.neg;
      local_1c8.fpclass = pnVar5[lVar13].m_backend.fpclass;
      local_1c8.prec_elem = pnVar5[lVar13].m_backend.prec_elem;
      feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_d0,this);
      uVar8 = local_258._72_8_;
      local_2a8.data._M_elems[0xc] = local_1d8[0];
      local_2a8.data._M_elems[0xd] = local_1d8[1];
      local_2a8.data._M_elems._56_5_ = auStack_1d0._0_5_;
      local_2a8.data._M_elems[0xf]._1_3_ = auStack_1d0[1]._1_3_;
      local_2a8.data._M_elems[8] = local_1e8[0];
      local_2a8.data._M_elems[9] = local_1e8[1];
      local_2a8.data._M_elems[10] = auStack_1e0[0];
      local_2a8.data._M_elems[0xb] = auStack_1e0[1];
      local_2a8.data._M_elems[4] = local_1f8[0];
      local_2a8.data._M_elems[5] = local_1f8[1];
      local_2a8.data._M_elems[6] = auStack_1f0[0];
      local_2a8.data._M_elems[7] = auStack_1f0[1];
      local_2a8.data._M_elems[0] = local_208[0];
      local_2a8.data._M_elems[1] = local_208[1];
      local_2a8.data._M_elems[2] = auStack_200[0];
      local_2a8.data._M_elems[3] = auStack_200[1];
      local_2a8.exp = iVar10;
      local_2a8.neg = bVar6;
      local_258.fpclass = (fpclass_type)uVar7;
      local_258.prec_elem = SUB84(uVar7,4);
      local_2a8.fpclass = local_258.fpclass;
      local_2a8.prec_elem = local_258.prec_elem;
      local_258._72_8_ = uVar8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&local_2a8,&local_1c8);
      if (local_2a8.fpclass == cpp_dec_float_NaN) {
        return false;
      }
      if (local_d0.fpclass == cpp_dec_float_NaN) {
        return false;
      }
      iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_2a8,&local_d0);
      if (-1 < iVar10) {
        return false;
      }
      bVar6 = 1 < lVar11;
      lVar11 = lVar13;
    } while (bVar6);
  }
  return true;
}

Assistant:

bool SPxMainSM<R>::checkSolution(SPxLPBase<R>& lp, VectorBase<R> sol)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);
      R activity = 0;

      for(int k = 0; k < row.size(); k++)
         activity += row.value(k) * sol[row.index(k)];

      if(!GE(activity, lp.lhs(i), feastol()) || !LE(activity, lp.rhs(i), feastol()))
         return false;
   }

   return true;
}